

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_render.h
# Opt level: O2

void embree::renderBenchFunc<embree::Tutorial>
               (BenchState *state,BenchParams *params,int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  int64_t iVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  size_t i_1;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  fmtflags __old;
  ISPCCamera ispccamera;
  Tutorial tutorial;
  double local_438;
  FilteredStatistics local_418;
  undefined8 local_3d8;
  FilteredStatistics local_3d0;
  ISPCCamera local_38c;
  TutorialApplication local_358;
  
  Tutorial::Tutorial((Tutorial *)&local_358);
  local_358.interactive = false;
  TutorialApplication::main(&local_358,argc,argv);
  TutorialApplication::resize(&local_358,local_358.width,local_358.height);
  Camera::getISPCCamera(&local_38c,&local_358.camera,(ulong)local_358.width,(ulong)local_358.height)
  ;
  lVar2 = *(long *)(std::cout + -0x18);
  uVar1 = *(uint *)(operator_delete__ + lVar2);
  local_3d8 = *(undefined8 *)(&std::bad_alloc::typeinfo + lVar2);
  *(uint *)(operator_delete__ + lVar2) = uVar1 & 0xfffffefb | 4;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 4;
  local_418.fskip_small = 0.5;
  local_418._4_8_ = 0;
  local_418.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _4_8_ = 0;
  local_418.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _12_8_ = 0;
  local_418.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_418.stat.v._0_4_ = 0;
  local_418.stat.v._4_4_ = 0;
  local_418.stat.v2 = 0.0;
  local_418.stat.vmin = INFINITY;
  local_418.stat.vmax = -INFINITY;
  local_418.stat.N = 0;
  local_3d0.fskip_small = 0.5;
  local_3d0._4_8_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _4_8_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _12_8_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_3d0.stat.v._0_4_ = 0;
  local_3d0.stat.v._4_4_ = 0;
  local_3d0.stat.v2 = 0.0;
  local_3d0.stat.vmin = INFINITY;
  local_3d0.stat.vmax = -INFINITY;
  local_3d0.stat.N = 0;
  uVar3 = (ulong)params->skipIterations;
  uVar7 = (long)params->minTimeOrIterations + uVar3;
  for (uVar6 = 0; uVar3 = (ulong)(int)uVar3, uVar6 < uVar3; uVar6 = uVar6 + 1) {
    TutorialApplication::initRayStats(&local_358);
    dVar9 = getSeconds();
    TutorialApplication::render
              (&local_358,local_358.pixels,local_358.width,local_358.height,0.0,&local_38c);
    dVar10 = getSeconds();
    local_438 = (double)local_38c.render_time;
    if ((local_38c.render_time == 0.0) && (!NAN(local_38c.render_time))) {
      local_438 = dVar10 - dVar9;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"frame [");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," / ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"]: ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::ostream::_M_insert<double>(1.0 / local_438);
    poVar4 = std::operator<<(poVar4," fps (skipped)");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    uVar3 = (ulong)(uint)params->skipIterations;
  }
  for (; uVar3 < uVar7; uVar3 = uVar3 + 1) {
    TutorialApplication::initRayStats(&local_358);
    dVar9 = getSeconds();
    TutorialApplication::render
              (&local_358,local_358.pixels,local_358.width,local_358.height,0.0,&local_38c);
    dVar10 = getSeconds();
    local_438 = (double)local_38c.render_time;
    if ((local_38c.render_time == 0.0) && (!NAN(local_38c.render_time))) {
      local_438 = dVar10 - dVar9;
    }
    dVar9 = 1.0 / local_438;
    FilteredStatistics::add(&local_418,(float)dVar9);
    iVar5 = TutorialApplication::getNumRays(&local_358);
    FilteredStatistics::add(&local_3d0,(float)((double)iVar5 / (local_438 * 1000000.0)));
    if ((0x3ff < (uint)uVar7) && ((uVar3 & 0x3f) == 0)) {
      auVar11._8_4_ = (int)(local_418.stat.N >> 0x20);
      auVar11._0_8_ = local_418.stat.N;
      auVar11._12_4_ = 0x45300000;
      local_438 = 0.0;
      if ((local_418.stat.N != 0) &&
         ((fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                          ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0))
                          ), fVar8 != 0.0 || (NAN(fVar8))))) {
        fVar8 = Statistics::getSigma(&local_418.stat);
        auVar12._8_4_ = (int)(local_418.stat.N >> 0x20);
        auVar12._0_8_ = local_418.stat.N;
        auVar12._12_4_ = 0x45300000;
        fVar18 = 0.0;
        if (local_418.stat.N != 0) {
          fVar18 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                          ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0))
                          );
        }
        local_438 = (double)((fVar8 * 100.0) / fVar18);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"frame [");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," / ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"]: ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)dVar9);
      poVar4 = std::operator<<(poVar4," fps, ");
      poVar4 = std::operator<<(poVar4,"min = ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmin);
      poVar4 = std::operator<<(poVar4," fps, ");
      poVar4 = std::operator<<(poVar4,"avg = ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      auVar13._8_4_ = (int)(local_418.stat.N >> 0x20);
      auVar13._0_8_ = local_418.stat.N;
      auVar13._12_4_ = 0x45300000;
      fVar8 = 0.0;
      if (local_418.stat.N != 0) {
        fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                       ((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0)));
      }
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
      poVar4 = std::operator<<(poVar4," fps, ");
      poVar4 = std::operator<<(poVar4,"max = ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmax);
      poVar4 = std::operator<<(poVar4," fps, ");
      poVar4 = std::operator<<(poVar4,"sigma = ");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
      fVar8 = Statistics::getSigma(&local_418.stat);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
      std::operator<<(poVar4," (");
      poVar4 = std::ostream::_M_insert<double>(local_438);
      poVar4 = std::operator<<(poVar4,"%)");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ostream::flush();
    }
  }
  local_438 = 0.0;
  if ((local_418.stat.N != 0) &&
     ((auVar14._8_4_ = (int)(local_418.stat.N >> 0x20), auVar14._0_8_ = local_418.stat.N,
      auVar14._12_4_ = 0x45300000,
      fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                     ((auVar14._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0))),
      fVar8 != 0.0 || (NAN(fVar8))))) {
    fVar18 = Statistics::getAvgSigma(&local_418.stat);
    fVar8 = 0.0;
    if (local_418.stat.N != 0) {
      auVar19._8_4_ = (int)(local_418.stat.N >> 0x20);
      auVar19._0_8_ = local_418.stat.N;
      auVar19._12_4_ = 0x45300000;
      fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                     ((auVar19._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0)));
    }
    local_438 = (double)((fVar18 * 100.0) / fVar8);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"frame [");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,params->skipIterations);
  poVar4 = std::operator<<(poVar4," - ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"]: ");
  poVar4 = std::operator<<(poVar4,"              ");
  poVar4 = std::operator<<(poVar4,"min = ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmin);
  poVar4 = std::operator<<(poVar4," fps, ");
  poVar4 = std::operator<<(poVar4,"avg = ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  fVar8 = 0.0;
  if (local_418.stat.N != 0) {
    auVar15._8_4_ = (int)(local_418.stat.N >> 0x20);
    auVar15._0_8_ = local_418.stat.N;
    auVar15._12_4_ = 0x45300000;
    fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                   ((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0)));
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  poVar4 = std::operator<<(poVar4," fps, ");
  poVar4 = std::operator<<(poVar4,"max = ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmax);
  poVar4 = std::operator<<(poVar4," fps, ");
  poVar4 = std::operator<<(poVar4,"sigma = ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 6;
  fVar8 = Statistics::getAvgSigma(&local_418.stat);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::operator<<(poVar4," (");
  poVar4 = std::ostream::_M_insert<double>(local_438);
  poVar4 = std::operator<<(poVar4,"%)");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MIN ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmin);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_AVG ");
  fVar8 = 0.0;
  if (local_418.stat.N != 0) {
    auVar16._8_4_ = (int)(local_418.stat.N >> 0x20);
    auVar16._0_8_ = local_418.stat.N;
    auVar16._12_4_ = 0x45300000;
    fVar8 = (float)((double)CONCAT44(local_418.stat.v._4_4_,local_418.stat.v._0_4_) /
                   ((auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_418.stat.N) - 4503599627370496.0)));
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MAX ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_418.stat.vmax);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_SIGMA ");
  fVar8 = Statistics::getSigma(&local_418.stat);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_AVG_SIGMA ");
  fVar8 = Statistics::getAvgSigma(&local_418.stat);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MIN ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3d0.stat.vmin);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG ");
  fVar8 = 0.0;
  if (local_3d0.stat.N != 0) {
    auVar17._8_4_ = (int)(local_3d0.stat.N >> 0x20);
    auVar17._0_8_ = local_3d0.stat.N;
    auVar17._12_4_ = 0x45300000;
    fVar8 = (float)((double)CONCAT44(local_3d0.stat.v._4_4_,local_3d0.stat.v._0_4_) /
                   ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_3d0.stat.N) - 4503599627370496.0)));
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MAX ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3d0.stat.vmax);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_SIGMA ");
  fVar8 = Statistics::getSigma(&local_3d0.stat);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG_SIGMA ");
  fVar8 = Statistics::getAvgSigma(&local_3d0.stat);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&local_3d0.v.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&local_418.v.super__Vector_base<float,_std::allocator<float>_>);
  *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) = uVar1;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = local_3d8;
  TutorialApplication::~TutorialApplication(&local_358);
  return;
}

Assistant:

static void renderBenchFunc(BenchState& state, BenchParams& params ,int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
    return;
  }

  Tutorial tutorial;
  tutorial.interactive = false;
  tutorial.main(argc,argv);

  tutorial.resize(tutorial.width, tutorial.height);
  ISPCCamera ispccamera = tutorial.camera.getISPCCamera(tutorial.width, tutorial.height);

  for (size_t i = 0; i < params.skipIterations; i++)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
  }

  size_t numRays = 0;
  for (auto _ : *state.state)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
    numRays += tutorial.getNumRays();
  }

  state.state->SetItemsProcessed(state.state->iterations());
  state.state->counters["Rays/s"] = benchmark::Counter(numRays, benchmark::Counter::kIsRate);
#else
  renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
#endif
}